

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O0

bool __thiscall
license::hw_identifier::HwIdentifier::data_match(HwIdentifier *this,array<unsigned_char,_7UL> *data)

{
  byte bVar1;
  value_type_conflict vVar2;
  byte *pbVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  bool local_2a;
  bool local_29;
  int local_20;
  bool local_19;
  int i;
  bool equals;
  array<unsigned_char,_7UL> *data_local;
  HwIdentifier *this_local;
  
  local_19 = true;
  local_20 = 0;
  while( true ) {
    local_29 = false;
    if (local_20 < 7) {
      local_29 = local_19;
    }
    if (local_29 == false) break;
    if (local_20 == 0) {
      pbVar3 = std::array<unsigned_char,_7UL>::operator[](data,0);
      bVar1 = *pbVar3;
      pbVar3 = std::array<unsigned_char,_8UL>::operator[](&this->m_data,1);
      local_2a = (bVar1 & 0x1f) == (*pbVar3 & 0x1f);
    }
    else {
      pvVar4 = std::array<unsigned_char,_7UL>::operator[](data,(long)local_20);
      vVar2 = *pvVar4;
      pvVar5 = std::array<unsigned_char,_8UL>::operator[](&this->m_data,(long)(local_20 + 1));
      local_2a = vVar2 == *pvVar5;
    }
    local_19 = local_2a;
    local_20 = local_20 + 1;
  }
  return local_19;
}

Assistant:

bool HwIdentifier::data_match(const std::array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>& data) const {
	bool equals = true;
	for (int i = 0; i < HW_IDENTIFIER_PROPRIETARY_DATA && equals; i++) {
		equals = (i == 0) ? ((data[i] & 0x1f) == (m_data[i + 1] & 0x1f)) : (data[i] == m_data[i + 1]);
	}
	return equals;
}